

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O0

boolean decode_mcu_DC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_decoder *pjVar2;
  int iVar3;
  int local_30;
  int blkn;
  int p1;
  uchar *st;
  arith_entropy_ptr_conflict entropy;
  JBLOCKROW *MCU_data_local;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)((long)&pjVar2[4].start_pass + 4) == 0) {
      process_restart(cinfo);
    }
    *(int *)((long)&pjVar2[4].start_pass + 4) = *(int *)((long)&pjVar2[4].start_pass + 4) + -1;
  }
  iVar1 = cinfo->Al;
  for (local_30 = 0; local_30 < cinfo->blocks_in_MCU; local_30 = local_30 + 1) {
    iVar3 = arith_decode(cinfo,(uchar *)&pjVar2[0x14].decode_mcu);
    if (iVar3 != 0) {
      (*MCU_data[local_30])[0] = (*MCU_data[local_30])[0] | (ushort)(1 << ((byte)iVar1 & 0x1f));
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_DC_refine (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{   
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  int p1 = 1 << cinfo->Al;	/* 1 in the bit position being coded */
  int blkn;
  JBLOCKROW block;
  BITREAD_STATE_VARS;

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (! process_restart(cinfo))
	return FALSE;
  }

  /* Not worth the cycles to check insufficient_data here,
   * since we will not change the data anyway if we read zeroes.
   */

  /* Load up working state */
  BITREAD_LOAD_STATE(cinfo,entropy->bitstate);

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];

    /* Encoded data is simply the next bit of the two's-complement DC value */
    CHECK_BIT_BUFFER(br_state, 1, return FALSE);
    if (GET_BITS(1))
      (*block)[0] |= p1;
    /* Note: since we use |=, repeating the assignment later is safe */
  }

  /* Completed MCU, so update state */
  BITREAD_SAVE_STATE(cinfo,entropy->bitstate);

  /* Account for restart interval (no-op if not using restarts) */
  entropy->restarts_to_go--;

  return TRUE;
}